

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O2

int handle_timeo(long currcms)

{
  uint uVar1;
  undefined8 uVar2;
  __u8 _Var3;
  __u8 _Var4;
  __u8 _Var5;
  __u8 _Var6;
  byte bVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  size_t __n;
  long lVar11;
  canfd_frame *pcVar12;
  char *__format;
  long lVar13;
  canfd_frame *pcVar14;
  snif *psVar15;
  long lVar16;
  byte bVar17;
  
  bVar7 = clearscreen;
  bVar17 = 0;
  if (clearscreen == 0) {
    if (print_eff == '\x01') {
      uVar2 = 0x23;
      if (name_sep != '\0') {
        uVar2 = 0x2a;
      }
      __format = "%s%sXX|ms%s-- ID --%sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >";
      pcVar9 = vdl;
    }
    else {
      uVar2 = 0x23;
      if (name_sep != '\0') {
        uVar2 = 0x2a;
      }
      __format = "%s%sXX|ms%sID %sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >";
      pcVar9 = " | ";
    }
    printf(__format,"\x1b[2J","\x1b[H",pcVar9,pcVar9,interface,uVar2,loop,hold,timeout,
           (ulong)(uint)idx);
    clearscreen = 1;
  }
  if (notch == '\x01') {
    uVar10 = 0;
    uVar8 = (ulong)(uint)idx;
    if (idx < 1) {
      uVar8 = uVar10;
    }
    lVar16 = 8;
    if (max_dlen != '\0') {
      lVar16 = 0x40;
    }
    lVar11 = 0x107298;
    for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
      for (lVar13 = 0; lVar16 != lVar13; lVar13 = lVar13 + 1) {
        *(byte *)(lVar11 + lVar13) = *(byte *)(lVar11 + lVar13) | *(byte *)(lVar11 + -0x48 + lVar13)
        ;
      }
      lVar11 = lVar11 + 0x158;
    }
    notch = '\0';
  }
  printf("%s","\x1b[H");
  handle_timeo::frame_count = handle_timeo::frame_count + 1;
  printf("%02d\n");
  handle_timeo::frame_count = handle_timeo::frame_count % 100;
  psVar15 = sniftab;
  for (lVar16 = 0; lVar16 < idx; lVar16 = lVar16 + 1) {
    uVar1 = psVar15->flags;
    if ((uVar1 & 1) != 0) {
      if ((uVar1 & 2) != 0) {
        if ((bVar7 & (uVar1 & 4) == 0) == 0) {
          print_snifline((int)lVar16);
          psVar15->hold = hold + currcms;
          *(byte *)&psVar15->flags = (byte)psVar15->flags & 0xfb;
        }
        else if (psVar15->hold < currcms && psVar15->hold != 0) {
          __n = 8;
          if (max_dlen != '\0') {
            __n = 0x40;
          }
          memset((psVar15->marker).data,0,__n);
          print_snifline((int)lVar16);
          psVar15->hold = 0;
        }
        else {
          printf("%s","\x1b[B");
        }
        if (psVar15->timeout < currcms && psVar15->timeout != 0) {
          *(byte *)&psVar15->flags = (byte)psVar15->flags & 0xf9;
          clearscreen = 0;
        }
      }
      pcVar12 = &psVar15->current;
      pcVar14 = &psVar15->last;
      for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
        _Var3 = pcVar12->len;
        _Var4 = pcVar12->flags;
        _Var5 = pcVar12->__res0;
        _Var6 = pcVar12->__res1;
        pcVar14->can_id = pcVar12->can_id;
        pcVar14->len = _Var3;
        pcVar14->flags = _Var4;
        pcVar14->__res0 = _Var5;
        pcVar14->__res1 = _Var6;
        pcVar12 = (canfd_frame *)((long)pcVar12 + ((ulong)bVar17 * -4 + 2) * 4);
        pcVar14 = (canfd_frame *)((long)pcVar14 + ((ulong)bVar17 * -4 + 2) * 4);
      }
    }
    psVar15 = psVar15 + 1;
  }
  return 1;
}

Assistant:

int handle_timeo(long currcms)
{
	int i, j;
	int force_redraw = 0;
	static unsigned int frame_count;

	if (clearscreen) {
		if (print_eff)
			printf("%s%sXX|ms%s-- ID --%sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >",
			       CLR_SCREEN, CSR_HOME, vdl, vdl, interface, name_sep, loop, hold, timeout, idx);
		else
			printf("%s%sXX|ms%sID %sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >",
			       CLR_SCREEN, CSR_HOME, ldl, ldl, interface, name_sep, loop, hold, timeout, idx);

		force_redraw = 1;
		clearscreen = 0;
	}

	if (notch) {
		for (i = 0; i < idx; i++) {
			for (j = 0; j < max_dlen; j++)
				sniftab[i].notch.data[j] |= sniftab[i].marker.data[j];
		}
		notch = 0;
	}

	printf("%s", CSR_HOME);
	printf("%02d\n", frame_count++); /* rolling display update counter */
	frame_count %= 100;

	for (i = 0; i < idx; i++) {
		if is_set(i, ENABLE) {
				if is_set(i, DISPLAY) {
						if (is_set(i, UPDATE) || (force_redraw)) {
							print_snifline(i);
							sniftab[i].hold = currcms + hold;
							do_clr(i, UPDATE);
						}
						else  if ((sniftab[i].hold) && (sniftab[i].hold < currcms)) {
								memset(&sniftab[i].marker.data, 0, max_dlen);
								print_snifline(i);
								sniftab[i].hold = 0; /* disable update by hold */
							}
						else
							printf("%s", CSR_DOWN); /* skip my line */

						if (sniftab[i].timeout && sniftab[i].timeout < currcms) {
							do_clr(i, DISPLAY);
							do_clr(i, UPDATE);
							clearscreen = 1; /* removed entry -> new drawing next time */
						}
					}
				sniftab[i].last      = sniftab[i].current;
			}
	}

	return 1; /* ok */
}